

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.h
# Opt level: O1

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::coSolve(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *x,
         VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *rhs)

{
  pointer pnVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar2;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  
  if ((int)((ulong)((long)(rhs->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(rhs->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 7) != 0) {
    if (this->factorized == false) {
      factorize(this);
    }
    (*this->factor->_vptr_SLinSolver[0x14])(this->factor,x,rhs);
    return;
  }
  pnVar1 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar2 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pnVar2 != pnVar1; pnVar2 = pnVar2 + 1) {
    (pnVar2->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar2->m_backend).prec_elem = 0x1c;
    (pnVar2->m_backend).data._M_elems[0] = 0;
    (pnVar2->m_backend).data._M_elems[1] = 0;
    (pnVar2->m_backend).data._M_elems[2] = 0;
    (pnVar2->m_backend).data._M_elems[3] = 0;
    (pnVar2->m_backend).data._M_elems[4] = 0;
    (pnVar2->m_backend).data._M_elems[5] = 0;
    (pnVar2->m_backend).data._M_elems[6] = 0;
    (pnVar2->m_backend).data._M_elems[7] = 0;
    (pnVar2->m_backend).data._M_elems[8] = 0;
    (pnVar2->m_backend).data._M_elems[9] = 0;
    (pnVar2->m_backend).data._M_elems[10] = 0;
    (pnVar2->m_backend).data._M_elems[0xb] = 0;
    (pnVar2->m_backend).data._M_elems[0xc] = 0;
    (pnVar2->m_backend).data._M_elems[0xd] = 0;
    (pnVar2->m_backend).data._M_elems[0xe] = 0;
    (pnVar2->m_backend).data._M_elems[0xf] = 0;
    (pnVar2->m_backend).data._M_elems[0x10] = 0;
    (pnVar2->m_backend).data._M_elems[0x11] = 0;
    (pnVar2->m_backend).data._M_elems[0x12] = 0;
    (pnVar2->m_backend).data._M_elems[0x13] = 0;
    (pnVar2->m_backend).data._M_elems[0x14] = 0;
    (pnVar2->m_backend).data._M_elems[0x15] = 0;
    (pnVar2->m_backend).data._M_elems[0x16] = 0;
    (pnVar2->m_backend).data._M_elems[0x17] = 0;
    (pnVar2->m_backend).data._M_elems[0x18] = 0;
    (pnVar2->m_backend).data._M_elems[0x19] = 0;
    (pnVar2->m_backend).data._M_elems[0x1a] = 0;
    (pnVar2->m_backend).data._M_elems[0x1b] = 0;
    *(undefined8 *)((long)(pnVar2->m_backend).data._M_elems + 0x6d) = 0;
  }
  return;
}

Assistant:

void coSolve(VectorBase<R>& x, const VectorBase<R>& rhs)
   {
      if(rhs.dim() == 0)
      {
         x.clear();
         return;
      }

      if(!factorized)
         SPxBasisBase<R>::factorize();

      factor->solveLeft(x, rhs);
   }